

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Logger * __thiscall el::Logger::operator=(Logger *this,Logger *logger)

{
  Logger *in_RSI;
  Logger *in_RDI;
  
  if (in_RSI != in_RDI) {
    el::base::utils::safeDelete<el::base::TypedConfigurations>((TypedConfigurations **)in_RSI);
    std::__cxx11::string::operator=((string *)&in_RDI->m_id,(string *)&in_RSI->m_id);
    in_RDI->m_typedConfigurations = in_RSI->m_typedConfigurations;
    std::__cxx11::string::operator=
              ((string *)&in_RDI->m_parentApplicationName,(string *)&in_RSI->m_parentApplicationName
              );
    in_RDI->m_isConfigured = (bool)(in_RSI->m_isConfigured & 1);
    Configurations::operator=((Configurations *)in_RSI,(Configurations *)in_RDI);
    el::base::utils::std::
    map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
    ::operator=((map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
                 *)in_RSI,
                (map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
                 *)in_RDI);
    in_RDI->m_logStreamsReference = in_RSI->m_logStreamsReference;
  }
  return in_RDI;
}

Assistant:

Logger& Logger::operator=(const Logger& logger) {
  if (&logger != this) {
    base::utils::safeDelete(m_typedConfigurations);
    m_id = logger.m_id;
    m_typedConfigurations = logger.m_typedConfigurations;
    m_parentApplicationName = logger.m_parentApplicationName;
    m_isConfigured = logger.m_isConfigured;
    m_configurations = logger.m_configurations;
    m_unflushedCount = logger.m_unflushedCount;
    m_logStreamsReference = logger.m_logStreamsReference;
  }
  return *this;
}